

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

void UnitTest::_UnitTest_Compare::print(char ch)

{
  ostream *poVar1;
  char *pcVar2;
  char ch_local;
  
  if (ch == '\n') {
    poVar1 = std::operator<<((ostream *)&std::cout,'\n');
    pcVar2 = _unittest_fail();
    std::operator<<(poVar1,pcVar2);
    if ((global_unit_test_object_[0x20] & 1) == 0) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_2745);
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,ch);
  }
  return;
}

Assistant:

static void print(const char ch) {
    if (ch == '\n') {
      std::cout << '\n' << _unittest_fail();
      if (!global_unit_test_object_.vim_lines) {
        std::cout << "│ ";
      }
    } else {
      std::cout << ch;
    }
  }